

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::remove_node(xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *parent;
  xml_node_struct *node_local;
  
  pxVar1 = node->parent;
  if (node->next_sibling == (xml_node_struct *)0x0) {
    pxVar1->first_child->prev_sibling_c = node->prev_sibling_c;
  }
  else {
    node->next_sibling->prev_sibling_c = node->prev_sibling_c;
  }
  if (node->prev_sibling_c->next_sibling == (xml_node_struct *)0x0) {
    pxVar1->first_child = node->next_sibling;
  }
  else {
    node->prev_sibling_c->next_sibling = node->next_sibling;
  }
  node->parent = (xml_node_struct *)0x0;
  node->prev_sibling_c = (xml_node_struct *)0x0;
  node->next_sibling = (xml_node_struct *)0x0;
  return;
}

Assistant:

inline void remove_node(xml_node_struct* node)
	{
		xml_node_struct* parent = node->parent;

		if (node->next_sibling)
			node->next_sibling->prev_sibling_c = node->prev_sibling_c;
		else
			parent->first_child->prev_sibling_c = node->prev_sibling_c;

		if (node->prev_sibling_c->next_sibling)
			node->prev_sibling_c->next_sibling = node->next_sibling;
		else
			parent->first_child = node->next_sibling;

		node->parent = 0;
		node->prev_sibling_c = 0;
		node->next_sibling = 0;
	}